

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

uint64_t __thiscall leveldb::anon_unknown_2::FileState::Size(FileState *this)

{
  long lVar1;
  uint64_t uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(&(this->blocks_mutex_).mu_);
  uVar2 = this->size_;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->blocks_mutex_);
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t Size() const {
    MutexLock lock(&blocks_mutex_);
    return size_;
  }